

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Phi(ImageInfiniteLight *this,SampledWavelengths *lambda)

{
  Image *this_00;
  float fVar1;
  Float *pFVar2;
  Point2i p;
  int c;
  int c_00;
  ulong uVar3;
  Float FVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [56];
  undefined1 auVar7 [16];
  undefined1 auVar9 [56];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  SampledSpectrum SVar12;
  Float local_ac;
  Float local_a8;
  Float local_a4;
  ulong local_a0;
  Tuple2<pbrt::Point2,_int> local_98;
  ulong local_90;
  ulong local_88;
  ImageInfiniteLight *local_80;
  SampledWavelengths *local_78;
  ulong local_70;
  RGB local_68;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  RGBIlluminantSpectrum local_48;
  undefined1 auVar8 [64];
  
  local_98 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_a0 = (ulong)local_98 >> 0x20;
  if (local_98.y < 1) {
    auVar10 = ZEXT816(0);
  }
  else {
    local_88 = (ulong)(local_98.x & 0x7fffffff);
    this_00 = &this->image;
    auVar11 = ZEXT864(0);
    local_90 = 0;
    local_80 = this;
    local_78 = lambda;
    do {
      if (0 < local_98.x) {
        local_70 = local_90 << 0x20;
        uVar3 = 0;
        do {
          c_00 = 0;
          _local_58 = auVar11._0_16_;
          local_a4 = 0.0;
          local_a8 = 0.0;
          local_ac = 0.0;
          p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_70 | uVar3);
          do {
            FVar4 = Image::GetChannel(this_00,p,c_00,(WrapMode2D)0x300000003);
            this = local_80;
            pFVar2 = &local_a4;
            if (c_00 != 0) {
              if (c_00 == 1) {
                pFVar2 = &local_a8;
              }
              else {
                pFVar2 = &local_ac;
              }
            }
            c_00 = c_00 + 1;
            *pFVar2 = FVar4;
          } while (c_00 != 3);
          auVar10 = vinsertps_avx(ZEXT416((uint)local_a4),ZEXT416((uint)local_a8),0x10);
          auVar10 = vmaxps_avx(auVar10,_DAT_003ea4e0);
          auVar6 = ZEXT856(auVar10._8_8_);
          auVar5 = vmaxss_avx(ZEXT416((uint)local_ac),ZEXT416(0));
          auVar9 = ZEXT856(auVar5._8_8_);
          local_68._0_8_ = vmovlps_avx(auVar10);
          local_68.b = auVar5._0_4_;
          RGBIlluminantSpectrum::RGBIlluminantSpectrum
                    (&local_48,local_80->imageColorSpace,&local_68);
          SVar12 = RGBIlluminantSpectrum::Sample(&local_48,local_78);
          auVar8._0_8_ = SVar12.values.values._8_8_;
          auVar8._8_56_ = auVar9;
          auVar11._0_8_ = SVar12.values.values._0_8_;
          auVar11._8_56_ = auVar6;
          auVar10 = vmovlhps_avx(auVar11._0_16_,auVar8._0_16_);
          uVar3 = uVar3 + 1;
          auVar11 = ZEXT1664(CONCAT412(auVar10._12_4_ + fStack_4c,
                                       CONCAT48(auVar10._8_4_ + fStack_50,
                                                CONCAT44(auVar10._4_4_ + (float)local_58._4_4_,
                                                         auVar10._0_4_ + (float)local_58._0_4_))));
        } while (uVar3 != local_88);
      }
      auVar10 = auVar11._0_16_;
      local_90 = local_90 + 1;
    } while (local_90 != local_a0);
  }
  fVar1 = this->sceneRadius * this->sceneRadius * 39.47842 * this->scale;
  auVar7._0_4_ = (float)((int)local_a0 * local_98.x);
  auVar5._0_4_ = fVar1 * auVar10._0_4_;
  auVar5._4_4_ = fVar1 * auVar10._4_4_;
  auVar5._8_4_ = fVar1 * auVar10._8_4_;
  auVar5._12_4_ = fVar1 * auVar10._12_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar10 = vdivps_avx(auVar5,auVar7);
  auVar5 = vshufpd_avx(auVar10,auVar10,1);
  SVar12.values.values._0_8_ = auVar10._0_8_;
  SVar12.values.values._8_8_ = auVar5._0_8_;
  return (SampledSpectrum)SVar12.values.values;
}

Assistant:

SampledSpectrum ImageInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    // We're computing fluence, then converting to power...
    SampledSpectrum sumL(0.);

    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        for (int u = 0; u < width; ++u) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({u, v}, c, WrapMode::OctahedralSphere);
            sumL +=
                RGBIlluminantSpectrum(*imageColorSpace, ClampZero(rgb)).Sample(lambda);
        }
    }
    // Integrating over the sphere, so 4pi for that.  Then one more for Pi
    // r^2 for the area of the disk receiving illumination...
    return 4 * Pi * Pi * Sqr(sceneRadius) * scale * sumL / (width * height);
}